

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpt.cpp
# Opt level: O1

bool pg::au(int *dst,int *src,int d,int k,int max,int maxopp,int pl)

{
  uint *puVar1;
  uint *puVar2;
  bool bVar3;
  long lVar4;
  uint *b;
  undefined1 uVar5;
  bool bVar6;
  uint uVar8;
  void *pvVar9;
  void *pvVar10;
  ulong uVar11;
  int iVar12;
  int *piVar13;
  int *dst_00;
  uint uVar14;
  size_t __n;
  void *pvVar15;
  long lVar16;
  undefined8 uStack_70;
  int aiStack_68 [2];
  uint *local_60;
  void *local_58;
  int local_4c;
  void *local_48;
  undefined1 *local_40;
  int *local_38;
  int iVar7;
  
  local_40 = (undefined1 *)CONCAT44(local_40._4_4_,max);
  pvVar15 = (void *)(ulong)(uint)k;
  uStack_70 = 0x172416;
  iVar7 = up(dst,src,d,k,pl);
  uVar5 = (undefined1)iVar7;
  if (iVar7 != -1) {
    local_38 = (int *)CONCAT44(local_38._4_4_,maxopp);
    pvVar9 = (void *)((long)pvVar15 * 4 + 0xfU & 0xfffffffffffffff0);
    lVar4 = -(long)pvVar9;
    dst_00 = (int *)((long)aiStack_68 + lVar4);
    bVar6 = 1 < k;
    piVar13 = aiStack_68;
    local_60 = (uint *)dst;
    local_58 = pvVar15;
    local_4c = d;
    local_48 = pvVar15;
    if (1 < k) {
      pvVar9 = (void *)(ulong)(k - 2U);
      uVar14 = k - 1;
      bVar6 = true;
      __n = 4;
      lVar16 = 0;
      do {
        iVar7 = (int)((long)pvVar9 + lVar16);
        uVar11 = (long)pvVar9 + lVar16 & 0xffffffff;
        uVar8 = src[uVar11];
        if (uVar8 == 0xffffffff) {
          dst_00[uVar11] = maxopp;
LAB_001724e9:
          piVar13 = aiStack_68;
          if (0 < (int)((k - 2U) + (int)lVar16)) {
            local_40 = (undefined1 *)aiStack_68;
            local_38 = dst_00;
            *(undefined8 *)((long)aiStack_68 + lVar4 + -8) = 0x172507;
            memcpy(dst_00,src,uVar11 << 2);
            piVar13 = (int *)local_40;
            dst_00 = local_38;
          }
          uVar8 = uVar14 + (int)lVar16;
          pvVar9 = (void *)(ulong)uVar8;
          bVar3 = (int)uVar8 < (int)local_48;
          if (bVar3) {
            *(undefined8 *)((long)aiStack_68 + lVar4 + -8) = 0x172537;
            pvVar9 = memset(dst_00 + (ulong)uVar14 + lVar16,0xff,__n);
          }
          break;
        }
        if ((uVar8 & 1) != pl) {
          if (1 - pl < (int)uVar8) {
            iVar12 = uVar8 - 2;
LAB_001724df:
            dst_00[uVar11] = iVar12;
          }
          else {
            if ((iVar7 == 0) || (src[uVar11 - 1] < pl)) goto LAB_001724bc;
            dst_00[uVar11] = pl;
          }
          goto LAB_001724e9;
        }
        if (iVar7 != 0) {
          iVar12 = uVar8 + 2;
          if ((iVar12 <= (int)local_40) && (iVar12 <= src[uVar11 - 1])) goto LAB_001724df;
        }
LAB_001724bc:
        bVar6 = 0 < iVar7;
        lVar16 = lVar16 + -1;
        __n = __n + 4;
        piVar13 = aiStack_68;
      } while ((ulong)uVar14 + lVar16 != 0);
    }
    iVar7 = local_4c;
    pvVar15 = local_58;
    b = local_60;
    if (bVar6) {
      iVar12 = (int)local_48;
      local_40 = (undefined1 *)piVar13;
      *(undefined8 *)((long)aiStack_68 + lVar4 + -8) = 0x17256b;
      up(dst_00,dst_00,iVar7,iVar12,pl);
      local_38 = dst_00;
      *(undefined8 *)((long)aiStack_68 + lVar4 + -8) = 0x172580;
      bVar6 = pm_less(dst_00,(int *)b,iVar12,pl);
      piVar13 = local_38;
      pvVar9 = (void *)(ulong)!bVar6;
      if (0 < iVar12 && bVar6) {
        *(undefined8 *)((long)aiStack_68 + lVar4 + -8) = 0x1725a0;
        pvVar9 = memcpy(b,piVar13,(long)pvVar15 * 4);
      }
      if ((0 < iVar12) && (pvVar9 = (void *)(ulong)*b, *b == *src)) {
        pvVar10 = (void *)0x1;
        do {
          pvVar9 = pvVar10;
          if (pvVar15 == pvVar10) break;
          puVar1 = b + (long)pvVar10;
          pvVar9 = (void *)((long)pvVar10 + 1);
          puVar2 = (uint *)(src + (long)pvVar10);
          pvVar10 = pvVar9;
        } while (*puVar1 == *puVar2);
      }
    }
    uVar5 = SUB81(pvVar9,0);
  }
  return (bool)uVar5;
}

Assistant:

static bool
au(int *dst, int *src, int d, int k, int max, int maxopp, int pl)
{
    // first compute normal update
    int j = up(dst, src, d, k, pl);
    if (j == -1) return false; // no difference, already smallest...

    // then compute antagonistic update and update the antagonistic measure
    int tmp[k];
    if (!bump(tmp, src, k, max, maxopp, pl)) return true; // no bump possible; but dst != src so return true
    up(tmp, tmp, d, k, pl);

    // use smallest updated measure
    if (pm_less(tmp, dst, k, pl)) {
        for (int i=0; i<k; i++) dst[i] = tmp[i];
    }

    // finally, check if different
    for (int i=0; i<k; i++) if (dst[i] != src[i]) return true;
    return false;
}